

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
          (View<TestType,_true,_std::allocator<unsigned_long>_> *this)

{
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  runtime_error *this_00;
  size_t sVar4;
  size_t j;
  size_t sVar5;
  
  sVar1 = (this->geometry_).dimension_;
  if (sVar1 == 0) {
    if ((this->geometry_).isSimple_ == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      if (this->data_ == (pointer)0x0) {
        return;
      }
      if ((this->geometry_).size_ == 1) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  else if (this->data_ == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    psVar2 = (this->geometry_).shape_;
    sVar4 = 1;
    sVar5 = 0;
    do {
      sVar4 = sVar4 * psVar2[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
    if ((this->geometry_).size_ == sVar4) {
      psVar3 = (this->geometry_).shapeStrides_;
      sVar5 = 1;
      sVar4 = sVar1;
      if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
        do {
          if (psVar3[sVar4 - 1] != sVar5) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0023423f;
          }
          sVar5 = sVar5 * psVar2[sVar4 - 1];
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      else {
        sVar4 = 0;
        do {
          if (psVar3[sVar4] != sVar5) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0023423f;
          }
          sVar5 = sVar5 * psVar2[sVar4];
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      if ((this->geometry_).isSimple_ == true) {
        sVar4 = 0;
        do {
          if ((this->geometry_).strides_[sVar4] != psVar3[sVar4]) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0023423f;
          }
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_0023423f:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline const std::size_t 
Geometry<A>::dimension() const
{
    return dimension_; 
}